

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation.c
# Opt level: O2

unsigned_long_long evaluate_literal_integer_hex(token *token,Translation_Data *translation_data)

{
  char cVar1;
  unsigned_long_long uVar2;
  ulong uVar3;
  char cVar4;
  
  uVar2 = 0;
  for (uVar3 = 2; uVar3 < token->data_size; uVar3 = uVar3 + 1) {
    cVar1 = token->data[uVar3];
    cVar4 = (5 < (byte)(cVar1 + 0x9fU)) * ' ' + -0x57;
    if (cVar1 < ':') {
      cVar4 = -0x30;
    }
    uVar2 = (uVar2 | (byte)(cVar4 + cVar1)) << 4;
  }
  return uVar2;
}

Assistant:

unsigned long long int evaluate_literal_integer_hex(struct token *token,struct Translation_Data *translation_data)
{
	unsigned long long int accumulate=0;
	unsigned char digit;
	size_t i;
	/* skip the leading 0x */
	for(i=2;i<token->data_size;++i)
	{
		if(token->data[i]<='9')
			digit=token->data[i]-'0';
		else if(token->data[i]<='f' && token->data[i]>='a')
			digit=10+(token->data[i]-'a');
		else
			digit=10+(token->data[i]-'A');
		accumulate|=digit,accumulate<<=4;
	}
	return accumulate;
}